

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
google::protobuf::Arena::
Create<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>(Arena *arena)

{
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar1;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  
  if (arena == (Arena *)0x0) {
    pCVar1 = (Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x28);
    (pCVar1->super_ContainerBase).arena = (Arena *)0x0;
    (pCVar1->unknown_fields)._M_dataplus._M_p = (pointer)0x0;
    (pCVar1->unknown_fields)._M_string_length = 0;
    (pCVar1->unknown_fields).field_2._M_allocated_capacity = 0;
  }
  else {
    pVar2 = AllocateAlignedWithCleanup
                      (arena,0x28,
                       (type_info *)
                       &internal::InternalMetadata::Container<std::__cxx11::string>::typeinfo);
    pCVar1 = (Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pVar2.first;
    (pVar2.second)->elem = pCVar1;
    (pVar2.second)->cleanup =
         internal::
         arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
    ;
    (pCVar1->super_ContainerBase).arena = (Arena *)0x0;
    (pCVar1->unknown_fields)._M_dataplus._M_p = (pointer)0x0;
    (pCVar1->unknown_fields)._M_string_length = 0;
    (pCVar1->unknown_fields).field_2._M_allocated_capacity = 0;
  }
  *(undefined8 *)((long)&(pCVar1->unknown_fields).field_2 + 8) = 0;
  (pCVar1->unknown_fields)._M_dataplus._M_p = (pointer)&(pCVar1->unknown_fields).field_2;
  (pCVar1->unknown_fields)._M_string_length = 0;
  (pCVar1->unknown_fields).field_2._M_local_buf[0] = '\0';
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return CreateInternal<T>(arena, std::is_convertible<T*, MessageLite*>(),
                             static_cast<Args&&>(args)...);
  }